

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
          (Array<capnp::_::DirectWireValue<unsigned_int>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }